

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall llvm::Triple::setArchName(Triple *this,StringRef Str)

{
  StringRef SVar1;
  SmallString<64U> Triple;
  Twine TStack_88;
  SmallVectorImpl<char> local_70;
  undefined1 local_60 [64];
  
  local_70.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_60;
  local_70.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_70.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x40;
  SmallVectorImpl<char>::append<char_const*,void>(&local_70,Str.Data,Str.Data + Str.Length);
  SmallVectorImpl<char>::append<char_const*,void>(&local_70,"-","");
  SVar1 = getVendorName(this);
  SmallVectorImpl<char>::append<char_const*,void>(&local_70,SVar1.Data,SVar1.Data + SVar1.Length);
  SmallVectorImpl<char>::append<char_const*,void>(&local_70,"-","");
  SVar1 = getOSAndEnvironmentName(this);
  SmallVectorImpl<char>::append<char_const*,void>(&local_70,SVar1.Data,SVar1.Data + SVar1.Length);
  Twine::Twine(&TStack_88,&local_70);
  setTriple(this,&TStack_88);
  SmallVectorImpl<char>::~SmallVectorImpl(&local_70);
  return;
}

Assistant:

void Triple::setArchName(StringRef Str) {
  // Work around a miscompilation bug for Twines in gcc 4.0.3.
  SmallString<64> Triple;
  Triple += Str;
  Triple += "-";
  Triple += getVendorName();
  Triple += "-";
  Triple += getOSAndEnvironmentName();
  setTriple(Triple);
}